

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemoryRegion_conflict * memory_region_get_flatview_root(MemoryRegion_conflict *mr)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  MemoryRegion *pMVar6;
  MemoryRegion *pMVar7;
  
  do {
    if (((MemoryRegion *)mr)->enabled != true) {
      return (MemoryRegion_conflict *)0x0;
    }
    if (((MemoryRegion *)mr)->terminates != false) {
      return (MemoryRegion_conflict *)(MemoryRegion *)mr;
    }
    pMVar7 = (((MemoryRegion *)mr)->subregions).tqh_first;
    if (pMVar7 == (MemoryRegion *)0x0) {
      return (MemoryRegion_conflict *)0x0;
    }
    bVar5 = false;
    pMVar6 = (MemoryRegion *)0x0;
    do {
      if (pMVar7->enabled == true) {
        if (bVar5) {
          return (MemoryRegion_conflict *)(MemoryRegion *)mr;
        }
        bVar5 = true;
        if ((pMVar7->addr == 0) &&
           (lVar2 = *(long *)((long)&((MemoryRegion *)mr)->size + 8),
           plVar1 = (long *)((long)&pMVar7->size + 8),
           uVar3 = (ulong)((ulong)((MemoryRegion *)mr)->size < (ulong)pMVar7->size),
           lVar4 = lVar2 - *plVar1,
           (SBORROW8(lVar2,*plVar1) != SBORROW8(lVar4,uVar3)) == (long)(lVar4 - uVar3) < 0)) {
          pMVar6 = pMVar7;
        }
      }
      pMVar7 = (pMVar7->subregions_link).tqe_next;
    } while (pMVar7 != (MemoryRegion *)0x0);
    pMVar7 = pMVar6;
    if (pMVar6 == (MemoryRegion *)0x0) {
      pMVar7 = (MemoryRegion *)mr;
    }
  } while ((bVar5) && (mr = (MemoryRegion_conflict *)pMVar7, pMVar6 != (MemoryRegion *)0x0));
  if (!bVar5) {
    mr = (MemoryRegion_conflict *)(MemoryRegion *)0x0;
  }
  return mr;
}

Assistant:

static MemoryRegion *memory_region_get_flatview_root(MemoryRegion *mr)
{
    while (mr->enabled) {
        if (!mr->terminates) {
            unsigned int found = 0;
            MemoryRegion *child, *next = NULL;
            QTAILQ_FOREACH(child, &mr->subregions, subregions_link) {
                if (child->enabled) {
                    if (++found > 1) {
                        next = NULL;
                        break;
                    }
                    if (!child->addr && int128_ge(mr->size, child->size)) {
                        /* A child is included in its entirety.  If it's the only
                         * enabled one, use it in the hope of finding an alias down the
                         * way. This will also let us share FlatViews.
                         */
                        next = child;
                    }
                }
            }
            if (found == 0) {
                return NULL;
            }
            if (next) {
                mr = next;
                continue;
            }
        }

        return mr;
    }

    return NULL;
}